

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

size_t ftxui::GlyphIterate(string *input,int glyph_offset,size_t start)

{
  int iVar1;
  
  if (glyph_offset < 0) {
    iVar1 = 1;
    if (1 < -glyph_offset) {
      iVar1 = -glyph_offset;
    }
    do {
      start = GlyphPrevious(input,start);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  else if (glyph_offset != 0) {
    do {
      start = GlyphNext(input,start);
      glyph_offset = glyph_offset + -1;
    } while (glyph_offset != 0);
  }
  return start;
}

Assistant:

size_t GlyphIterate(const std::string& input, int glyph_offset, size_t start) {
  if (glyph_offset >= 0) {
    for (int i = 0; i < glyph_offset; ++i) {
      start = GlyphNext(input, start);
    }
    return start;
  } else {
    for (int i = 0; i < -glyph_offset; ++i) {
      start = GlyphPrevious(input, start);
    }
    return start;
  }
}